

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto3Type::SetDouble(Field f,Msg *msg,double x)

{
  double dVar1;
  int32_t iVar2;
  Field *this;
  unsigned_long value;
  double local_20;
  double x_local;
  Msg *msg_local;
  Field f_local;
  
  local_20 = x;
  x_local = (double)msg;
  msg_local = (Msg *)f;
  RecordAsSeen(f,msg);
  dVar1 = x_local;
  this = ResolverPool::Field::proto((Field *)msg_local);
  iVar2 = Field::number(this);
  io::CodedOutputStream::WriteTag((CodedOutputStream *)dVar1,iVar2 << 3 | 1);
  dVar1 = x_local;
  value = absl::lts_20240722::bit_cast<unsigned_long,_double,_0>(&local_20);
  io::CodedOutputStream::WriteLittleEndian64((CodedOutputStream *)dVar1,value);
  return;
}

Assistant:

static void SetDouble(Field f, Msg& msg, double x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_FIXED64);
    msg.stream_.WriteLittleEndian64(absl::bit_cast<uint64_t>(x));
  }